

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O1

bool __thiscall cmOrderDirectories::IsSameDirectory(cmOrderDirectories *this,string *l,string *r)

{
  size_t __n;
  int iVar1;
  string *psVar2;
  string *psVar3;
  bool bVar4;
  
  psVar2 = GetRealPath(this,l);
  psVar3 = GetRealPath(this,r);
  __n = psVar2->_M_string_length;
  if (__n == psVar3->_M_string_length) {
    if (__n == 0) {
      bVar4 = true;
    }
    else {
      iVar1 = bcmp((psVar2->_M_dataplus)._M_p,(psVar3->_M_dataplus)._M_p,__n);
      bVar4 = iVar1 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool cmOrderDirectories::IsSameDirectory(std::string const& l,
                                         std::string const& r)
{
  return this->GetRealPath(l) == this->GetRealPath(r);
}